

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,UntypedFormatSpecImpl format,
          Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  bool bVar1;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  UntypedFormatSpecImpl format_00;
  FormatRawSinkImpl raw_sink;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  args_00.len_ = (size_type)args.ptr_;
  args_00.ptr_ = (pointer)format.size_;
  format_00.size_ = (size_t)format.data_;
  format_00.data_ = this;
  raw_sink.write_ = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  raw_sink.sink_ = __return_storage_ptr__;
  bVar1 = FormatUntyped(raw_sink,format_00,args_00);
  if (!bVar1) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatPack(UntypedFormatSpecImpl format,
                       absl::Span<const FormatArgImpl> args) {
  std::string out;
  if (ABSL_PREDICT_FALSE(!FormatUntyped(&out, format, args))) {
    out.clear();
  }
  return out;
}